

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c_sse42.cc
# Opt level: O2

uint32_t crc32c::ExtendSse42(uint32_t crc,uint8_t *data,size_t size)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  ulong uVar3;
  long lVar4;
  undefined8 uVar5;
  ulong uVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint uVar9;
  undefined8 uVar10;
  ulong uVar11;
  long lVar12;
  long in_FS_OFFSET;
  
  puVar7 = data + size;
  uVar9 = ~crc;
  puVar1 = (uint8_t *)((ulong)(data + 7) & 0xfffffffffffffff8);
  puVar8 = data;
  if (puVar1 <= puVar7) {
    for (; puVar8 = puVar1, data != puVar1; data = data + 1) {
      uVar9 = crc32(uVar9,*data);
    }
  }
  uVar3 = (ulong)uVar9;
  while (lVar4 = (long)puVar7 - (long)puVar8, 0x3fbf < lVar4) {
    puVar8 = puVar8 + 0x2a80;
    uVar6 = 0;
    uVar11 = 0;
    for (uVar9 = 0; uVar9 < 0x1540; uVar9 = uVar9 + 0x40) {
      uVar2 = crc32(uVar3,*(undefined8 *)(puVar8 + -0x2a80));
      uVar5 = crc32(uVar6,*(undefined8 *)(puVar8 + -0x1540));
      uVar10 = crc32(uVar11,*(undefined8 *)puVar8);
      uVar2 = crc32(uVar2,*(undefined8 *)(puVar8 + -0x2a78));
      uVar5 = crc32(uVar5,*(undefined8 *)(puVar8 + -0x1538));
      uVar10 = crc32(uVar10,*(undefined8 *)(puVar8 + 8));
      uVar2 = crc32(uVar2,*(undefined8 *)(puVar8 + -0x2a70));
      uVar5 = crc32(uVar5,*(undefined8 *)(puVar8 + -0x1530));
      uVar10 = crc32(uVar10,*(undefined8 *)(puVar8 + 0x10));
      uVar2 = crc32(uVar2,*(undefined8 *)(puVar8 + -0x2a68));
      uVar5 = crc32(uVar5,*(undefined8 *)(puVar8 + -0x1528));
      uVar10 = crc32(uVar10,*(undefined8 *)(puVar8 + 0x18));
      uVar2 = crc32(uVar2,*(undefined8 *)(puVar8 + -0x2a60));
      uVar5 = crc32(uVar5,*(undefined8 *)(puVar8 + -0x1520));
      uVar10 = crc32(uVar10,*(undefined8 *)(puVar8 + 0x20));
      uVar2 = crc32(uVar2,*(undefined8 *)(puVar8 + -0x2a58));
      uVar5 = crc32(uVar5,*(undefined8 *)(puVar8 + -0x1518));
      uVar10 = crc32(uVar10,*(undefined8 *)(puVar8 + 0x28));
      uVar2 = crc32(uVar2,*(undefined8 *)(puVar8 + -0x2a50));
      uVar5 = crc32(uVar5,*(undefined8 *)(puVar8 + -0x1510));
      uVar10 = crc32(uVar10,*(undefined8 *)(puVar8 + 0x30));
      uVar3 = crc32(uVar2,*(undefined8 *)(puVar8 + -0x2a48));
      uVar6 = crc32(uVar5,*(undefined8 *)(puVar8 + -0x1508));
      uVar11 = crc32(uVar10,*(undefined8 *)(puVar8 + 0x38));
      puVar8 = puVar8 + 0x40;
    }
    uVar6 = uVar6 ^ (*(uint *)((anonymous_namespace)::kBlock0SkipTable +
                              (ulong)((uint)(uVar3 >> 2) & 0x3c) + 0x40) ^
                     *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                              (ulong)((uint)uVar3 & 0xf) * 4) ^
                     *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                              (ulong)((uint)(uVar3 >> 6) & 0x3c) + 0x80) ^
                     *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                              (ulong)((uint)(uVar3 >> 10) & 0x3c) + 0xc0) ^
                     *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                              (ulong)((uint)(uVar3 >> 0xe) & 0x3c) + 0x100) ^
                     *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                              (ulong)((uint)(uVar3 >> 0x12) & 0x3c) + 0x140) ^
                     *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                              (ulong)((uint)(uVar3 >> 0x16) & 0x3c) + 0x180) ^
                    *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                             (ulong)((uint)uVar3 >> 0x1c) * 4 + 0x1c0));
    uVar3 = uVar11 ^ (*(uint *)((anonymous_namespace)::kBlock0SkipTable +
                               (ulong)((uint)(uVar6 >> 2) & 0x3c) + 0x40) ^
                      *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                               (ulong)((uint)uVar6 & 0xf) * 4) ^
                      *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                               (ulong)((uint)(uVar6 >> 6) & 0x3c) + 0x80) ^
                      *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                               (ulong)((uint)(uVar6 >> 10) & 0x3c) + 0xc0) ^
                      *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                               (ulong)((uint)(uVar6 >> 0xe) & 0x3c) + 0x100) ^
                      *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                               (ulong)((uint)(uVar6 >> 0x12) & 0x3c) + 0x140) ^
                      *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                               (ulong)((uint)(uVar6 >> 0x16) & 0x3c) + 0x180) ^
                     *(uint *)((anonymous_namespace)::kBlock0SkipTable + (uVar6 >> 0x1c) * 4 + 0x1c0
                              ));
  }
  for (; 0xfef < (long)puVar7 - (long)puVar8; puVar8 = puVar8 + 0xff0) {
    uVar11 = 0;
    uVar6 = 0;
    for (lVar12 = 0; (uint)lVar12 < 0x550; lVar12 = lVar12 + 8) {
      uVar3 = crc32(uVar3,*(undefined8 *)(puVar8 + lVar12));
      uVar11 = crc32(uVar11,*(undefined8 *)(puVar8 + lVar12 + 0x550));
      uVar6 = crc32(uVar6,*(undefined8 *)(puVar8 + lVar12 + 0xaa0));
    }
    uVar11 = uVar11 ^ (*(uint *)((anonymous_namespace)::kBlock1SkipTable +
                                (ulong)((uint)(uVar3 >> 2) & 0x3c) + 0x40) ^
                       *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                                (ulong)((uint)uVar3 & 0xf) * 4) ^
                       *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                                (ulong)((uint)(uVar3 >> 6) & 0x3c) + 0x80) ^
                       *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                                (ulong)((uint)(uVar3 >> 10) & 0x3c) + 0xc0) ^
                       *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                                (ulong)((uint)(uVar3 >> 0xe) & 0x3c) + 0x100) ^
                       *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                                (ulong)((uint)(uVar3 >> 0x12) & 0x3c) + 0x140) ^
                       *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                                (ulong)((uint)(uVar3 >> 0x16) & 0x3c) + 0x180) ^
                      *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                               (ulong)((uint)uVar3 >> 0x1c) * 4 + 0x1c0));
    uVar3 = uVar6 ^ (*(uint *)((anonymous_namespace)::kBlock1SkipTable +
                              (ulong)((uint)(uVar11 >> 2) & 0x3c) + 0x40) ^
                     *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                              (ulong)((uint)uVar11 & 0xf) * 4) ^
                     *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                              (ulong)((uint)(uVar11 >> 6) & 0x3c) + 0x80) ^
                     *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                              (ulong)((uint)(uVar11 >> 10) & 0x3c) + 0xc0) ^
                     *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                              (ulong)((uint)(uVar11 >> 0xe) & 0x3c) + 0x100) ^
                     *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                              (ulong)((uint)(uVar11 >> 0x12) & 0x3c) + 0x140) ^
                     *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                              (ulong)((uint)(uVar11 >> 0x16) & 0x3c) + 0x180) ^
                    *(uint *)((anonymous_namespace)::kBlock1SkipTable + (uVar11 >> 0x1c) * 4 + 0x1c0
                             ));
    lVar4 = lVar4 + -0xff0;
  }
  for (; 0x3ef < (long)puVar7 - (long)puVar8; puVar8 = puVar8 + 0x3f0) {
    uVar11 = 0;
    uVar6 = 0;
    for (lVar12 = 0; (uint)lVar12 < 0x150; lVar12 = lVar12 + 8) {
      uVar3 = crc32(uVar3,*(undefined8 *)(puVar8 + lVar12));
      uVar11 = crc32(uVar11,*(undefined8 *)(puVar8 + lVar12 + 0x150));
      uVar6 = crc32(uVar6,*(undefined8 *)(puVar8 + lVar12 + 0x2a0));
    }
    uVar11 = uVar11 ^ (*(uint *)((anonymous_namespace)::kBlock2SkipTable +
                                (ulong)((uint)(uVar3 >> 2) & 0x3c) + 0x40) ^
                       *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                                (ulong)((uint)uVar3 & 0xf) * 4) ^
                       *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                                (ulong)((uint)(uVar3 >> 6) & 0x3c) + 0x80) ^
                       *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                                (ulong)((uint)(uVar3 >> 10) & 0x3c) + 0xc0) ^
                       *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                                (ulong)((uint)(uVar3 >> 0xe) & 0x3c) + 0x100) ^
                       *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                                (ulong)((uint)(uVar3 >> 0x12) & 0x3c) + 0x140) ^
                       *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                                (ulong)((uint)(uVar3 >> 0x16) & 0x3c) + 0x180) ^
                      *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                               (ulong)((uint)uVar3 >> 0x1c) * 4 + 0x1c0));
    uVar3 = uVar6 ^ (*(uint *)((anonymous_namespace)::kBlock2SkipTable +
                              (ulong)((uint)(uVar11 >> 2) & 0x3c) + 0x40) ^
                     *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                              (ulong)((uint)uVar11 & 0xf) * 4) ^
                     *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                              (ulong)((uint)(uVar11 >> 6) & 0x3c) + 0x80) ^
                     *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                              (ulong)((uint)(uVar11 >> 10) & 0x3c) + 0xc0) ^
                     *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                              (ulong)((uint)(uVar11 >> 0xe) & 0x3c) + 0x100) ^
                     *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                              (ulong)((uint)(uVar11 >> 0x12) & 0x3c) + 0x140) ^
                     *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                              (ulong)((uint)(uVar11 >> 0x16) & 0x3c) + 0x180) ^
                    *(uint *)((anonymous_namespace)::kBlock2SkipTable + (uVar11 >> 0x1c) * 4 + 0x1c0
                             ));
    lVar4 = lVar4 + -0x3f0;
  }
  for (; 0xf < lVar4; lVar4 = lVar4 + -0x10) {
    uVar2 = crc32(uVar3,*(undefined8 *)puVar8);
    uVar3 = crc32(uVar2,*(undefined8 *)(puVar8 + 8));
    puVar8 = puVar8 + 0x10;
  }
  for (; puVar8 != puVar7; puVar8 = puVar8 + 1) {
    uVar9 = crc32((uint)uVar3,*puVar8);
    uVar3 = (ulong)uVar9;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return ~(uint)uVar3;
}

Assistant:

uint32_t ExtendSse42(uint32_t crc, const uint8_t* data, size_t size) {
  const uint8_t* p = data;
  const uint8_t* e = data + size;
  uint32_t l = crc ^ kCRC32Xor;

#define STEP1                  \
  do {                         \
    l = _mm_crc32_u8(l, *p++); \
  } while (0)

#define STEP4(crc)                             \
  do {                                         \
    crc = _mm_crc32_u32(crc, ReadUint32LE(p)); \
    p += 4;                                    \
  } while (0)

#define STEP8(crc, data)                          \
  do {                                            \
    crc = _mm_crc32_u64(crc, ReadUint64LE(data)); \
    data += 8;                                    \
  } while (0)

#define STEP8BY3(crc0, crc1, crc2, p0, p1, p2) \
  do {                                         \
    STEP8(crc0, p0);                           \
    STEP8(crc1, p1);                           \
    STEP8(crc2, p2);                           \
  } while (0)

#define STEP8X3(crc0, crc1, crc2, bs)                     \
  do {                                                    \
    crc0 = _mm_crc32_u64(crc0, ReadUint64LE(p));          \
    crc1 = _mm_crc32_u64(crc1, ReadUint64LE(p + bs));     \
    crc2 = _mm_crc32_u64(crc2, ReadUint64LE(p + 2 * bs)); \
    p += 8;                                               \
  } while (0)

#define SKIP_BLOCK(crc, tab)                                      \
  do {                                                            \
    crc = tab[0][crc & 0xf] ^ tab[1][(crc >> 4) & 0xf] ^          \
          tab[2][(crc >> 8) & 0xf] ^ tab[3][(crc >> 12) & 0xf] ^  \
          tab[4][(crc >> 16) & 0xf] ^ tab[5][(crc >> 20) & 0xf] ^ \
          tab[6][(crc >> 24) & 0xf] ^ tab[7][(crc >> 28) & 0xf];  \
  } while (0)

  // Point x at first 8-byte aligned byte in the buffer. This might be past the
  // end of the buffer.
  const uint8_t* x = RoundUp<8>(p);
  if (x <= e) {
    // Process bytes p is 8-byte aligned.
    while (p != x) {
      STEP1;
    }
  }

  // Proccess the data in predetermined block sizes with tables for quickly
  // combining the checksum. Experimentally it's better to use larger block
  // sizes where possible so use a hierarchy of decreasing block sizes.
  uint64_t l64 = l;
  while ((e - p) >= kGroups * kBlock0Size) {
    uint64_t l641 = 0;
    uint64_t l642 = 0;
    for (int i = 0; i < kBlock0Size; i += 8 * 8) {
      // Prefetch ahead to hide latency.
      RequestPrefetch(p + kPrefetchHorizon);
      RequestPrefetch(p + kBlock0Size + kPrefetchHorizon);
      RequestPrefetch(p + 2 * kBlock0Size + kPrefetchHorizon);

      // Process 64 bytes at a time.
      STEP8X3(l64, l641, l642, kBlock0Size);
      STEP8X3(l64, l641, l642, kBlock0Size);
      STEP8X3(l64, l641, l642, kBlock0Size);
      STEP8X3(l64, l641, l642, kBlock0Size);
      STEP8X3(l64, l641, l642, kBlock0Size);
      STEP8X3(l64, l641, l642, kBlock0Size);
      STEP8X3(l64, l641, l642, kBlock0Size);
      STEP8X3(l64, l641, l642, kBlock0Size);
    }

    // Combine results.
    SKIP_BLOCK(l64, kBlock0SkipTable);
    l64 ^= l641;
    SKIP_BLOCK(l64, kBlock0SkipTable);
    l64 ^= l642;
    p += (kGroups - 1) * kBlock0Size;
  }
  while ((e - p) >= kGroups * kBlock1Size) {
    uint64_t l641 = 0;
    uint64_t l642 = 0;
    for (int i = 0; i < kBlock1Size; i += 8) {
      STEP8X3(l64, l641, l642, kBlock1Size);
    }
    SKIP_BLOCK(l64, kBlock1SkipTable);
    l64 ^= l641;
    SKIP_BLOCK(l64, kBlock1SkipTable);
    l64 ^= l642;
    p += (kGroups - 1) * kBlock1Size;
  }
  while ((e - p) >= kGroups * kBlock2Size) {
    uint64_t l641 = 0;
    uint64_t l642 = 0;
    for (int i = 0; i < kBlock2Size; i += 8) {
      STEP8X3(l64, l641, l642, kBlock2Size);
    }
    SKIP_BLOCK(l64, kBlock2SkipTable);
    l64 ^= l641;
    SKIP_BLOCK(l64, kBlock2SkipTable);
    l64 ^= l642;
    p += (kGroups - 1) * kBlock2Size;
  }

  // Process bytes 16 at a time
  while ((e - p) >= 16) {
    STEP8(l64, p);
    STEP8(l64, p);
  }

  l = static_cast<uint32_t>(l64);
  // Process the last few bytes.
  while (p != e) {
    STEP1;
  }
#undef SKIP_BLOCK
#undef STEP8X3
#undef STEP8BY3
#undef STEP8
#undef STEP4
#undef STEP1

  return l ^ kCRC32Xor;
}